

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm.cpp
# Opt level: O1

void wasm::handleUnreachable(Block *block,Breakability breakability)

{
  uintptr_t uVar1;
  size_t sVar2;
  bool bVar3;
  undefined8 in_RCX;
  char *pcVar4;
  ulong uVar5;
  Name target;
  
  uVar1 = (block->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id;
  if (uVar1 != 1) {
    sVar2 = (block->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
            .usedElements;
    pcVar4 = (char *)CONCAT71((int7)((ulong)in_RCX >> 8),sVar2 == 0);
    if (uVar1 == 0 && sVar2 != 0) {
      uVar5 = 0;
      do {
        if ((block->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
            .usedElements <= uVar5) {
          __assert_fail("index < usedElements",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/mixed_arena.h"
                        ,0xbc,
                        "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::operator[](size_t) const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                       );
        }
        uVar1 = ((block->list).
                 super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.data
                 [uVar5]->type).id;
        if (uVar1 == 1) {
          if (breakability == Unknown) {
            target.super_IString.str._M_str = pcVar4;
            target.super_IString.str._M_len = (size_t)(block->name).super_IString.str._M_str;
            bVar3 = BranchUtils::BranchSeeker::has
                              ((BranchSeeker *)block,
                               (Expression *)(block->name).super_IString.str._M_len,target);
            breakability = NoBreak - bVar3;
          }
          if (breakability == NoBreak) {
            (block->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id = 1;
          }
        }
      } while ((uVar1 != 1) && (bVar3 = sVar2 - 1 != uVar5, uVar5 = uVar5 + 1, bVar3));
    }
  }
  return;
}

Assistant:

static void handleUnreachable(Block* block, Block::Breakability breakability) {
  if (block->type == Type::unreachable) {
    return; // nothing to do
  }
  if (block->list.size() == 0) {
    return; // nothing to do
  }
  // if we are concrete, stop - even an unreachable child
  // won't change that (since we have a break with a value,
  // or the final child flows out a value)
  if (block->type.isConcrete()) {
    return;
  }
  // look for an unreachable child
  for (auto* child : block->list) {
    if (child->type == Type::unreachable) {
      // there is an unreachable child, so we are unreachable, unless we have a
      // break
      if (breakability == Block::Unknown) {
        breakability = BranchUtils::BranchSeeker::has(block, block->name)
                         ? Block::HasBreak
                         : Block::NoBreak;
      }
      if (breakability == Block::NoBreak) {
        block->type = Type::unreachable;
      }
      return;
    }
  }
}